

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_flush(BGZF *fp)

{
  uint64_t *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong nbytes;
  
  if ((fp->field_0x2 & 3) != 0) {
    if (fp->mt != (bgzf_mtaux_t *)0x0) {
      if (fp->block_offset != 0) {
        mt_queue(fp);
      }
      iVar2 = mt_flush_queue(fp);
      return iVar2;
    }
    while (iVar2 = fp->block_offset, 0 < iVar2) {
      if (fp->idx_build_otf != 0) {
        bgzf_index_add_block(fp);
        iVar2 = fp->block_offset;
        puVar1 = &fp->idx->ublock_addr;
        *puVar1 = *puVar1 + (long)iVar2;
      }
      uVar3 = deflate_block(fp,iVar2);
      if ((int)uVar3 < 0) {
        return -1;
      }
      nbytes = (ulong)uVar3;
      uVar4 = hwrite(fp->fp,fp->compressed_block,nbytes);
      if (uVar4 != nbytes) {
        *(byte *)fp = *(byte *)fp | 4;
        return -1;
      }
      fp->block_address = fp->block_address + nbytes;
    }
  }
  return 0;
}

Assistant:

int bgzf_flush(BGZF *fp)
{
    if (!fp->is_write) return 0;
#ifdef BGZF_MT
    if (fp->mt) {
        if (fp->block_offset) mt_queue(fp); // guaranteed that assertion does not fail
        return mt_flush_queue(fp);
    }
#endif
    while (fp->block_offset > 0) {
        if ( fp->idx_build_otf )
        {
            bgzf_index_add_block(fp);
            fp->idx->ublock_addr += fp->block_offset;
        }
        int block_length = deflate_block(fp, fp->block_offset);
        if (block_length < 0) return -1;
        if (hwrite(fp->fp, fp->compressed_block, block_length) != block_length) {
            fp->errcode |= BGZF_ERR_IO; // possibly truncated file
            return -1;
        }
        fp->block_address += block_length;
    }
    return 0;
}